

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O2

nbt_node * parse_unnamed_tag(nbt_type type,char *name,char **memory,size_t *length)

{
  int32_t *piVar1;
  int64_t *piVar2;
  list_head *plVar3;
  int8_t *piVar4;
  int16_t *piVar5;
  uint8_t *puVar6;
  nbt_node *__ptr;
  char *pcVar7;
  undefined8 *puVar8;
  nbt_node *pnVar9;
  uchar *puVar10;
  int *piVar11;
  nbt_type nVar12;
  uint uVar13;
  ulong uVar14;
  int32_t i;
  uint *puVar15;
  long lVar16;
  list_head *plVar17;
  int iVar18;
  nbt_list *pnVar19;
  size_t sVar20;
  ulong __size;
  long lVar21;
  uint8_t type_1;
  nbt_list *local_48;
  uchar *local_40;
  uint local_38 [2];
  
  __ptr = (nbt_node *)malloc(0x20);
  if (__ptr == (nbt_node *)0x0) {
    piVar11 = __errno_location();
    *piVar11 = -2;
    goto switchD_00103643_default;
  }
  __ptr->type = type;
  __ptr->name = name;
  switch(type) {
  case TAG_BYTE:
    if (*length == 0) goto switchD_00103643_default;
    piVar4 = *memory;
    (__ptr->payload).tag_byte = *piVar4;
    be2ne(&__ptr->payload,1);
    *memory = piVar4 + 1;
    *length = *length - 1;
    break;
  case TAG_SHORT:
    if (*length < 2) goto switchD_00103643_default;
    piVar5 = (int16_t *)*memory;
    (__ptr->payload).tag_short = *piVar5;
    be2ne(&__ptr->payload,2);
    *memory = (char *)(piVar5 + 1);
    *length = *length - 2;
    break;
  case TAG_INT:
  case TAG_FLOAT:
    if (*length < 4) goto switchD_00103643_default;
    piVar1 = (int32_t *)*memory;
    (__ptr->payload).tag_int = *piVar1;
    be2ne(&__ptr->payload,4);
    *memory = (char *)(piVar1 + 1);
    *length = *length - 4;
    break;
  case TAG_LONG:
  case TAG_DOUBLE:
    if (*length < 8) goto switchD_00103643_default;
    piVar2 = (int64_t *)*memory;
    (__ptr->payload).tag_long = *piVar2;
    be2ne(&__ptr->payload,8);
    *memory = (char *)(piVar2 + 1);
    *length = *length - 8;
    break;
  case TAG_BYTE_ARRAY:
    local_40 = (uchar *)0x0;
    if (*length < 4) {
LAB_00103bcf:
      piVar11 = __errno_location();
      if (*piVar11 == 0) {
        *piVar11 = -1;
      }
      free(local_40);
      puVar10 = (uchar *)0x0;
      uVar13 = local_38[0];
    }
    else {
      local_38[0] = *(uint *)*memory;
      pnVar19 = (nbt_list *)((long)*memory + 4);
      be2ne(local_38,4);
      uVar13 = local_38[0];
      *memory = (char *)pnVar19;
      uVar14 = *length - 4;
      *length = uVar14;
      __size = (ulong)(int)local_38[0];
      local_48 = pnVar19;
      if ((long)__size < 0) goto LAB_00103bcf;
      puVar10 = (uchar *)malloc(__size);
      local_40 = puVar10;
      if (puVar10 == (uchar *)0x0) {
        piVar11 = __errno_location();
        *piVar11 = -2;
        goto LAB_00103bcf;
      }
      if (uVar14 < __size) goto LAB_00103bcf;
      memcpy(puVar10,local_48,__size);
      *memory = (char *)((long)&local_48->data + __size);
      *length = uVar14 - __size;
    }
    (__ptr->payload).tag_byte_array.data = puVar10;
    (__ptr->payload).tag_byte_array.length = uVar13;
    break;
  case TAG_STRING:
    pnVar19 = (nbt_list *)read_string(memory,length);
    goto LAB_00103bbe;
  case TAG_LIST:
    pnVar19 = (nbt_list *)malloc(0x18);
    local_48 = pnVar19;
    if (pnVar19 == (nbt_list *)0x0) {
LAB_00103b21:
      piVar11 = __errno_location();
      *piVar11 = -2;
    }
    else {
      pnVar9 = (nbt_node *)malloc(0x20);
      pnVar19->data = pnVar9;
      if (pnVar9 == (nbt_node *)0x0) goto LAB_00103b21;
      plVar17 = &pnVar19->entry;
      (pnVar19->entry).blink = plVar17;
      (pnVar19->entry).flink = plVar17;
      if (*length != 0) {
        puVar6 = (uint8_t *)*memory;
        type_1 = *puVar6;
        be2ne(&type_1,1);
        *memory = (char *)(puVar6 + 1);
        sVar20 = *length;
        *length = sVar20 - 1;
        if (3 < sVar20 - 1) {
          local_40 = (uchar *)CONCAT44(local_40._4_4_,*(undefined4 *)(puVar6 + 1));
          be2ne(&local_40,4);
          *memory = (char *)(puVar6 + 5);
          *length = *length - 4;
          nVar12 = TAG_COMPOUND;
          if (type_1 != '\0') {
            nVar12 = (nbt_type)type_1;
          }
          local_48->data->type = nVar12;
          for (iVar18 = 0; pnVar19 = local_48, iVar18 < (int)local_40; iVar18 = iVar18 + 1) {
            puVar8 = (undefined8 *)malloc(0x18);
            if (puVar8 == (undefined8 *)0x0) goto LAB_00103b21;
            pnVar9 = parse_unnamed_tag((uint)type_1,(char *)0x0,memory,length);
            *puVar8 = pnVar9;
            if (pnVar9 == (nbt_node *)0x0) {
              free(puVar8);
              goto LAB_00103b2c;
            }
            puVar8[2] = plVar17;
            plVar3 = plVar17->blink;
            puVar8[1] = plVar3;
            plVar17->blink = (list_head *)(puVar8 + 1);
            plVar3->flink = (list_head *)(puVar8 + 1);
          }
          goto LAB_00103bbe;
        }
      }
    }
LAB_00103b2c:
    piVar11 = __errno_location();
    pnVar19 = local_48;
    if (*piVar11 == 0) {
      *piVar11 = -1;
    }
    goto LAB_00103bb7;
  case TAG_COMPOUND:
    pnVar19 = (nbt_list *)malloc(0x18);
    if (pnVar19 == (nbt_list *)0x0) {
      piVar11 = __errno_location();
      *piVar11 = -2;
    }
    else {
      pnVar19->data = (nbt_node *)0x0;
      plVar17 = &pnVar19->entry;
      (pnVar19->entry).blink = plVar17;
      (pnVar19->entry).flink = plVar17;
      local_48 = pnVar19;
      while (*length != 0) {
        pcVar7 = *memory;
        local_40 = (uchar *)CONCAT71(local_40._1_7_,*pcVar7);
        be2ne(&local_40,1);
        *memory = pcVar7 + 1;
        *length = *length - 1;
        pnVar19 = local_48;
        if ((byte)local_40 == '\0') goto LAB_00103bbe;
        pcVar7 = read_string(memory,length);
        if (pcVar7 == (char *)0x0) break;
        puVar8 = (undefined8 *)malloc(0x18);
        if (puVar8 == (undefined8 *)0x0) {
          piVar11 = __errno_location();
          *piVar11 = -2;
LAB_00103b9a:
          free(pcVar7);
          break;
        }
        pnVar9 = parse_unnamed_tag((uint)(byte)local_40,pcVar7,memory,length);
        *puVar8 = pnVar9;
        if (pnVar9 == (nbt_node *)0x0) {
          free(puVar8);
          goto LAB_00103b9a;
        }
        puVar8[2] = plVar17;
        plVar3 = plVar17->blink;
        puVar8[1] = plVar3;
        plVar17->blink = (list_head *)(puVar8 + 1);
        plVar3->flink = (list_head *)(puVar8 + 1);
      }
      piVar11 = __errno_location();
      pnVar19 = local_48;
      if (*piVar11 == 0) {
        *piVar11 = -1;
      }
    }
LAB_00103bb7:
    nbt_free_list(pnVar19);
    pnVar19 = (nbt_list *)0x0;
LAB_00103bbe:
    (__ptr->payload).tag_long = (int64_t)pnVar19;
    break;
  case TAG_INT_ARRAY:
    local_40 = (uchar *)0x0;
    if (*length < 4) goto LAB_00103b58;
    local_38[0] = *(uint *)*memory;
    puVar15 = (uint *)((long)*memory + 4);
    be2ne(local_38,4);
    *memory = (char *)puVar15;
    pnVar19 = (nbt_list *)(*length - 4);
    *length = (size_t)pnVar19;
    uVar14 = (ulong)(int)local_38[0];
    if ((long)uVar14 < 0) goto LAB_00103b58;
    local_48 = (nbt_list *)(uVar14 * 4);
    local_40 = (uchar *)malloc((size_t)local_48);
    if (local_40 == (uchar *)0x0) {
LAB_00103b4d:
      piVar11 = __errno_location();
      *piVar11 = -2;
      goto LAB_00103b58;
    }
    sVar20 = (long)pnVar19 - (long)local_48;
    if (pnVar19 < local_48) goto LAB_00103b58;
    memcpy(local_40,puVar15,(size_t)local_48);
    *memory = (char *)((long)puVar15 + (long)local_48);
    *length = sVar20;
    lVar21 = 0;
    for (lVar16 = 0; uVar13 = (uint)uVar14, puVar10 = local_40, lVar16 < (int)uVar13;
        lVar16 = lVar16 + 1) {
      be2ne(local_40 + lVar21,4);
      uVar14 = (ulong)local_38[0];
      lVar21 = lVar21 + 4;
    }
    goto LAB_00103b75;
  case TAG_LONG_ARRAY:
    local_40 = (uchar *)0x0;
    if (3 < *length) {
      local_38[0] = *(uint *)*memory;
      puVar15 = (uint *)((long)*memory + 4);
      be2ne(local_38,4);
      *memory = (char *)puVar15;
      pnVar19 = (nbt_list *)(*length - 4);
      *length = (size_t)pnVar19;
      uVar14 = (ulong)(int)local_38[0];
      if (-1 < (long)uVar14) {
        local_48 = (nbt_list *)(uVar14 * 8);
        local_40 = (uchar *)malloc((size_t)local_48);
        if (local_40 == (uchar *)0x0) goto LAB_00103b4d;
        sVar20 = (long)pnVar19 - (long)local_48;
        if (local_48 <= pnVar19) {
          memcpy(local_40,puVar15,(size_t)local_48);
          *memory = (char *)((long)puVar15 + (long)local_48);
          *length = sVar20;
          lVar21 = 0;
          for (lVar16 = 0; puVar10 = local_40, uVar13 = (uint)uVar14, lVar16 < (int)(uint)uVar14;
              lVar16 = lVar16 + 1) {
            be2ne(local_40 + lVar21,8);
            uVar14 = (ulong)local_38[0];
            lVar21 = lVar21 + 8;
          }
          goto LAB_00103b75;
        }
      }
    }
LAB_00103b58:
    piVar11 = __errno_location();
    if (*piVar11 == 0) {
      *piVar11 = -1;
    }
    free(local_40);
    puVar10 = (uchar *)0x0;
    uVar13 = local_38[0];
LAB_00103b75:
    (__ptr->payload).tag_byte_array.data = puVar10;
    (__ptr->payload).tag_byte_array.length = uVar13;
    break;
  default:
    goto switchD_00103643_default;
  }
  piVar11 = __errno_location();
  if (*piVar11 == 0) {
    return __ptr;
  }
switchD_00103643_default:
  piVar11 = __errno_location();
  if (*piVar11 == 0) {
    *piVar11 = -1;
  }
  free(__ptr);
  return (nbt_node *)0x0;
}

Assistant:

static nbt_node* parse_unnamed_tag(nbt_type type, char* name, const char** memory, size_t* length)
{
    nbt_node* node;

    CHECKED_MALLOC(node, sizeof *node, goto parse_error);

    node->type = type;
    node->name = name;

#define COPY_INTO_PAYLOAD(payload_name) \
    READ_GENERIC(&node->payload.payload_name, sizeof node->payload.payload_name, swapped_memscan, goto parse_error);

    switch(type)
    {
    case TAG_BYTE:
        COPY_INTO_PAYLOAD(tag_byte);
        break;
    case TAG_SHORT:
        COPY_INTO_PAYLOAD(tag_short);
        break;
    case TAG_INT:
        COPY_INTO_PAYLOAD(tag_int);
        break;
    case TAG_LONG:
        COPY_INTO_PAYLOAD(tag_long);
        break;
    case TAG_FLOAT:
        COPY_INTO_PAYLOAD(tag_float);
        break;
    case TAG_DOUBLE:
        COPY_INTO_PAYLOAD(tag_double);
        break;
    case TAG_BYTE_ARRAY:
        node->payload.tag_byte_array = read_byte_array(memory, length);
        break;
    case TAG_INT_ARRAY:
        node->payload.tag_int_array = read_int_array(memory, length);
        break;
    case TAG_LONG_ARRAY:
        node->payload.tag_long_array = read_long_array(memory, length);
        break;
    case TAG_STRING:
        node->payload.tag_string = read_string(memory, length);
        break;
    case TAG_LIST:
        node->payload.tag_list = read_list(memory, length);
        break;
    case TAG_COMPOUND:
        node->payload.tag_compound = read_compound(memory, length);
        break;

    default:
        goto parse_error; /* Unknown node or TAG_END. Either way, we shouldn't be parsing this. */
    }

#undef COPY_INTO_PAYLOAD

    if(errno != NBT_OK) goto parse_error;

    return node;

parse_error:
    if(errno == NBT_OK)
        errno = NBT_ERR;

    free(node);
    return NULL;
}